

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackJamTargetIdentifier.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::TrackJamTargetIdentifier::operator==
          (TrackJamTargetIdentifier *this,TrackJamTargetIdentifier *Value)

{
  long lVar1;
  long lVar2;
  
  lVar1._0_2_ = (this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID;
  lVar1._2_2_ = (this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16ApplicationID;
  lVar1._4_4_ = *(undefined4 *)&(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xc;
  lVar2._0_2_ = (Value->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID;
  lVar2._2_2_ = (Value->super_EntityIdentifier).super_SimulationIdentifier.m_ui16ApplicationID;
  lVar2._4_4_ = *(undefined4 *)&(Value->super_EntityIdentifier).super_SimulationIdentifier.field_0xc
  ;
  return lVar1 == lVar2;
}

Assistant:

KBOOL TrackJamTargetIdentifier::operator == ( const TrackJamTargetIdentifier & Value ) const
{
    if( m_ui16SiteID        != Value.m_ui16SiteID )         return false;
    if( m_ui16ApplicationID != Value.m_ui16ApplicationID )  return false;
    if( m_ui16EntityID      != Value.m_ui16EntityID )       return false;
    if( m_ui8EmitterID      != Value.m_ui8EmitterID )       return false;
    if( m_ui8BeamID         != Value.m_ui8BeamID )          return false;
    return true;
}